

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_DimOrdinate::GetTightBoundingBox
          (ON_OBSOLETE_V5_DimOrdinate *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform
          )

{
  ON_Plane *this_00;
  ON_2dPoint *pOVar1;
  bool bVar2;
  ON_3dPointArray P;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count == 2
     ) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,2);
    this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    ON_Plane::PointAt(&local_48,this_00,pOVar1->x,pOVar1->y);
    ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    ON_Plane::PointAt(&local_48,this_00,pOVar1[1].x,pOVar1[1].y);
    ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
    bVar2 = ON_3dPointArray::GetTightBoundingBox
                      ((ON_3dPointArray *)&local_60,tight_bbox,bGrowBox,xform);
    bGrowBox = bVar2 || bGrowBox;
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  else if (bGrowBox) {
    bVar2 = ON_BoundingBox::IsValid(tight_bbox);
    if (!bVar2) {
      ON_BoundingBox::Destroy(tight_bbox);
      bGrowBox = false;
    }
  }
  return bGrowBox;
}

Assistant:

bool ON_OBSOLETE_V5_DimOrdinate::GetTightBoundingBox( ON_BoundingBox& tight_bbox,
                                                 bool bGrowBox,
                                                 const ON_Xform* xform) const
{
  if( m_points.Count() == 2)
  {
    ON_3dPointArray P(2);

    P.Append( m_plane.PointAt( m_points[0].x, m_points[0].y));
    P.Append( m_plane.PointAt( m_points[1].x, m_points[1].y));

    if ( P.GetTightBoundingBox( tight_bbox, bGrowBox, xform))
      bGrowBox = true;
  }
  else if( bGrowBox && !tight_bbox.IsValid())
  {
    tight_bbox.Destroy();
    bGrowBox = false;
  }

  return( 0 != bGrowBox);
}